

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

char * hdr_gettoken(stbi *z,char *buffer)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = get8(z);
  lVar4 = 0;
  while( true ) {
    if ((FILE *)z->img_file == (FILE *)0x0) {
      uVar2 = (uint)(z->img_buffer_end <= z->img_buffer);
    }
    else {
      uVar2 = feof((FILE *)z->img_file);
    }
    if ((uVar2 != 0) || ((uVar1 & 0xff) == 10)) goto LAB_00150722;
    buffer[lVar4] = (char)uVar1;
    if (lVar4 == 0x3fe) break;
    uVar1 = get8(z);
    lVar4 = lVar4 + 1;
  }
  lVar4 = 0x3ff;
  do {
    if ((FILE *)z->img_file == (FILE *)0x0) {
      uVar1 = (uint)(z->img_buffer_end <= z->img_buffer);
    }
    else {
      uVar1 = feof((FILE *)z->img_file);
    }
    if (uVar1 != 0) break;
    iVar3 = get8(z);
  } while (iVar3 != 10);
LAB_00150722:
  buffer[lVar4] = '\0';
  return buffer;
}

Assistant:

static char *hdr_gettoken(stbi *z, char *buffer)
{
   int len=0;
	//char *s = buffer,
	char c = '\0';

   c = get8(z);

	while (!at_eof(z) && c != '\n') {
		buffer[len++] = c;
      if (len == HDR_BUFLEN-1) {
         // flush to end of line
         while (!at_eof(z) && get8(z) != '\n')
            ;
         break;
      }
      c = get8(z);
	}

   buffer[len] = 0;
	return buffer;
}